

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O0

void gba_write_word(uint32_t addr,uint32_t value,access_type_t access_type)

{
  uint8_t uVar1;
  byte bVar2;
  _Bool _Var3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int in_EDX;
  uint uVar9;
  uint uVar10;
  uint in_ESI;
  uint in_EDI;
  bool bVar11;
  uint32_t index_4;
  uint32_t index_3;
  uint32_t index_2;
  uint8_t size;
  uint32_t index_1;
  uint32_t index;
  uint16_t region;
  uint32_t regnum_7;
  uint32_t shifted_value_7;
  uint32_t offset_7;
  uint16_t shifted_value_6;
  uint32_t offset_6;
  uint8_t size_4;
  uint32_t regnum_5;
  uint32_t shifted_value_5;
  uint32_t offset_5;
  uint16_t shifted_value_4;
  uint32_t offset_4;
  uint8_t size_3;
  uint32_t regnum_3;
  uint32_t shifted_value_3;
  uint32_t offset_3;
  uint16_t shifted_value_2;
  uint32_t offset_2;
  uint8_t size_2;
  uint32_t regnum_1;
  uint32_t shifted_value_1;
  uint32_t offset_1;
  uint16_t shifted_value;
  uint32_t offset;
  uint8_t size_1;
  uint32_t *ioreg_1;
  uint32_t *initial;
  uint32_t *current;
  uint32_t maskedaddr;
  uint32_t *ioreg_3;
  uint32_t *initial_1;
  uint32_t *current_1;
  uint32_t maskedaddr_1;
  uint32_t *ioreg_5;
  uint32_t *initial_2;
  uint32_t *current_2;
  uint32_t maskedaddr_2;
  uint32_t *ioreg_7;
  uint32_t *initial_3;
  uint32_t *current_3;
  uint32_t maskedaddr_3;
  uint32_t *warr_5;
  uint32_t *warr_4;
  uint32_t *warr_3;
  uint32_t *warr_2;
  uint32_t *warr_1;
  uint32_t *warr;
  uint32_t *ioreg_10;
  uint32_t *initial_4;
  uint32_t *current_4;
  uint32_t maskedaddr_4;
  uint16_t old_value_4;
  uint16_t *ioreg_8;
  uint16_t old_value_5;
  uint16_t *ioreg_9;
  uint16_t old_value;
  uint16_t *ioreg;
  uint16_t old_value_1;
  uint16_t *ioreg_2;
  uint16_t old_value_2;
  uint16_t *ioreg_4;
  uint16_t old_value_3;
  uint16_t *ioreg_6;
  uint32_t regnum_6;
  uint32_t regnum_4;
  uint32_t regnum_2;
  uint32_t regnum;
  uint32_t regnum_9;
  uint32_t regnum_8;
  uint16_t uVar12;
  undefined8 in_stack_fffffffffffffb00;
  uint32_t in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 local_390;
  char local_370;
  char local_368;
  char local_354;
  char local_338;
  char local_330;
  bg_referencepoint_container_t *local_300;
  bg_referencepoint_t *local_2f8;
  bg_referencepoint_container_t *local_2d8;
  bg_referencepoint_t *local_2d0;
  bg_referencepoint_container_t *local_2b0;
  bg_referencepoint_t *local_2a8;
  bg_referencepoint_container_t *local_288;
  bg_referencepoint_t *local_280;
  uint32_t local_1c4;
  bg_referencepoint_container_t *local_1b8;
  bg_referencepoint_t *local_1b0;
  ushort local_184;
  ushort local_16c;
  ushort local_154;
  ushort local_13c;
  ushort local_124;
  ushort local_10c;
  gba_ppu_t *local_f8;
  gba_ppu_t *local_e0;
  gba_ppu_t *local_c8;
  gbabus_t *local_b0;
  gba_ppu_t *local_98;
  gbabus_t *local_80;
  addr_27b_t *local_48;
  addr_27b_t *local_38;
  addr_27b_t *local_28;
  addr_27b_t *local_18;
  addr_27b_t *local_8;
  
  local_390 = in_EDI & 0xfffffffc;
  uVar4 = (ushort)local_390._3_1_;
  if (in_EDX != 0) {
    if (in_EDX == 1) {
      cpu->this_step_ticks = sequential_word_cycles[uVar4] + cpu->this_step_ticks;
    }
    else if (in_EDX == 2) {
      cpu->this_step_ticks = nonsequential_word_cycles[uVar4] + cpu->this_step_ticks;
    }
  }
  uVar8 = (uint32_t)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  bVar2 = (byte)in_ESI;
  switch(uVar4) {
  case 0:
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  Tried to write to the BIOS!\n\x1b[0;m");
    }
    break;
  case 2:
    *(uint *)(mem->ewram + (int)(local_390 + 0xfe000000 & 0x3ffff)) = in_ESI;
    break;
  case 3:
    *(uint *)(mem->iwram + (int)(local_390 + 0xfd000000 & 0x7fff)) = in_ESI;
    break;
  case 4:
    if (0x40003ff < local_390) {
      return;
    }
    uVar1 = get_ioreg_size_for_addr(local_390);
    switch(uVar1) {
    case '\0':
      return;
    case '\x01':
      _Var3 = is_ioreg_writable(local_390);
      if (_Var3) {
        uVar1 = get_ioreg_size_for_addr(local_390);
        if (uVar1 == '\x02') {
          local_154 = 0xff;
          uVar6 = in_EDI & 0xffc;
          switch(uVar6) {
          case 0:
            local_b0 = (gbabus_t *)&ppu->DISPCNT;
            break;
          case 4:
            local_b0 = (gbabus_t *)&ppu->DISPSTAT;
            break;
          case 8:
            local_b0 = (gbabus_t *)&ppu->BG0CNT;
            break;
          case 0xc:
            local_b0 = (gbabus_t *)&ppu->BG2CNT;
            break;
          case 0x10:
            local_b0 = (gbabus_t *)&ppu->BG0HOFS;
            break;
          case 0x14:
            local_b0 = (gbabus_t *)&ppu->BG1HOFS;
            break;
          case 0x18:
            local_b0 = (gbabus_t *)&ppu->BG2HOFS;
            break;
          case 0x1c:
            local_b0 = (gbabus_t *)&ppu->BG3HOFS;
            break;
          case 0x20:
            local_b0 = (gbabus_t *)&ppu->BG2PA;
            break;
          case 0x24:
            local_b0 = (gbabus_t *)&ppu->BG2PC;
            break;
          default:
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x1ce);
            fprintf(_stderr,"Access to unknown (but valid) half ioreg addr 0x%08X\n\x1b[0;m",
                    (ulong)local_390);
            exit(1);
          case 0x30:
            local_b0 = (gbabus_t *)&ppu->BG3PA;
            break;
          case 0x34:
            local_b0 = (gbabus_t *)&ppu->BG3PC;
            break;
          case 0x40:
            local_b0 = (gbabus_t *)&ppu->WIN0H;
            break;
          case 0x44:
            local_b0 = (gbabus_t *)&ppu->WIN0V;
            break;
          case 0x48:
            local_b0 = (gbabus_t *)&ppu->WININ;
            break;
          case 0x4c:
            local_b0 = (gbabus_t *)&ppu->MOSAIC;
            break;
          case 0x50:
            local_b0 = (gbabus_t *)&ppu->BLDCNT;
            break;
          case 0x54:
            local_b0 = (gbabus_t *)&ppu->BLDY;
            break;
          case 0x60:
          case 100:
          case 0x68:
          case 0x6c:
          case 0x70:
          case 0x74:
          case 0x78:
          case 0x7c:
          case 0x80:
          case 0x84:
          case 0x90:
          case 0x94:
          case 0x98:
          case 0x9c:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m",
                     (ulong)uVar6);
            }
            local_b0 = (gbabus_t *)0x0;
            break;
          case 0x88:
            local_b0 = (gbabus_t *)&bus->SOUNDBIAS;
            break;
          case 0xb8:
            local_b0 = (gbabus_t *)&bus->DMA0CNT_L;
            break;
          case 0xc4:
            local_b0 = (gbabus_t *)&bus->DMA1CNT_L;
            break;
          case 0xd0:
            local_b0 = (gbabus_t *)&bus->DMA2CNT_L;
            break;
          case 0xdc:
            local_b0 = (gbabus_t *)&bus->DMA3CNT_L;
            break;
          case 0x100:
            local_b0 = (gbabus_t *)bus->TMCNT_L;
            break;
          case 0x104:
            local_b0 = (gbabus_t *)(bus->TMCNT_L + 1);
            break;
          case 0x108:
            local_b0 = (gbabus_t *)(bus->TMCNT_L + 2);
            break;
          case 0x10c:
            local_b0 = (gbabus_t *)(bus->TMCNT_L + 3);
            break;
          case 0x120:
          case 0x124:
          case 0x128:
          case 0x150:
          case 0x154:
          case 0x158:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m",
                     (ulong)uVar6);
            }
            local_b0 = (gbabus_t *)0x0;
            break;
          case 0x130:
            local_b0 = (gbabus_t *)&bus->KEYINPUT;
            break;
          case 0x134:
            local_b0 = (gbabus_t *)&bus->RCNT;
            break;
          case 0x140:
            local_b0 = (gbabus_t *)&bus->JOYCNT;
            break;
          case 0x200:
            local_b0 = (gbabus_t *)&bus->interrupt_enable;
            break;
          case 0x204:
            local_b0 = (gbabus_t *)&bus->WAITCNT;
            break;
          case 0x208:
            local_b0 = bus;
          }
          if (local_b0 == (gbabus_t *)0x0) {
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m",
                     (ulong)local_390);
            }
          }
          else {
            uVar6 = in_EDI & 0xffc;
            if (uVar6 == 4) {
              local_154 = 0xf8;
            }
            else {
              if (uVar6 == 0x202) {
                (bus->IF).raw = (bus->IF).raw & (bVar2 ^ 0xffff);
                goto LAB_00147abd;
              }
              if (uVar6 == 0x208) {
                local_154 = 1;
              }
            }
            uVar12 = ((bg_rotation_scaling_t *)&local_b0->interrupt_master_enable)->raw;
            ((bg_rotation_scaling_t *)&local_b0->interrupt_master_enable)->raw =
                 ((bg_rotation_scaling_t *)&local_b0->interrupt_master_enable)->raw & ~local_154;
            ((bg_rotation_scaling_t *)&local_b0->interrupt_master_enable)->raw =
                 ((bg_rotation_scaling_t *)&local_b0->interrupt_master_enable)->raw |
                 bVar2 & local_154;
            uVar6 = in_EDI & 0xffc;
            if (uVar6 == 0xb8) {
LAB_00147158:
              gba_dma();
            }
            else if (uVar6 == 0xba) {
              if (-1 < (short)(bus->DMA0CNT_H).raw) {
                (bus->DMA0INT).previously_enabled = false;
              }
              gba_dma();
            }
            else {
              if (uVar6 == 0xc4) goto LAB_00147158;
              if (uVar6 == 0xc6) {
                if (-1 < (short)(bus->DMA1CNT_H).raw) {
                  (bus->DMA1INT).previously_enabled = false;
                }
                gba_dma();
              }
              else {
                if (uVar6 == 0xd0) goto LAB_00147158;
                if (uVar6 == 0xd2) {
                  if (-1 < (short)(bus->DMA2CNT_H).raw) {
                    (bus->DMA2INT).previously_enabled = false;
                  }
                  gba_dma();
                }
                else {
                  if (uVar6 == 0xdc) goto LAB_00147158;
                  if (uVar6 == 0xde) {
                    if (-1 < (short)(bus->DMA3CNT_H).raw) {
                      (bus->DMA3INT).previously_enabled = false;
                    }
                    gba_dma();
                  }
                  else if (uVar6 == 0x102) {
                    tmcnth_write(0,uVar12);
                  }
                  else if (uVar6 == 0x106) {
                    tmcnth_write(1,uVar12);
                  }
                  else if (uVar6 == 0x10a) {
                    tmcnth_write(2,uVar12);
                  }
                  else if (uVar6 == 0x10e) {
                    tmcnth_write(3,uVar12);
                  }
                  else if (uVar6 == 0x204) {
                    on_waitcnt_updated();
                  }
                }
              }
            }
          }
        }
        else if (uVar1 == '\x04') {
          uVar6 = in_ESI & 0xff;
          uVar9 = in_EDI & 0xffc;
          if ((((uVar9 == 0x28) || (uVar9 == 0x2c)) || (uVar9 == 0x38)) || (uVar9 == 0x3c)) {
            switch(uVar9) {
            case 0x28:
              local_2f8 = &(ppu->BG2X).current;
              local_300 = &ppu->BG2X;
              break;
            case 0x2c:
              local_2f8 = &(ppu->BG2Y).current;
              local_300 = &ppu->BG2Y;
              break;
            default:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                      ,0x298);
              fprintf(_stderr,"Fatal error- should not have ended up here.\n\x1b[0;m");
              exit(1);
            case 0x38:
              local_2f8 = &(ppu->BG3X).current;
              local_300 = &ppu->BG3X;
              break;
            case 0x3c:
              local_2f8 = &(ppu->BG3Y).current;
              local_300 = &ppu->BG3Y;
            }
            bVar11 = false;
            if (0xa0 < ppu->y) {
              bVar11 = ppu->y != 0xe3;
            }
            if (!bVar11) {
              local_2f8->raw = local_2f8->raw & 0xffffff00;
              local_2f8->raw = uVar6 | local_2f8->raw;
            }
            (local_300->initial).raw = (local_300->initial).raw & 0xffffff00;
            (local_300->initial).raw = uVar6 | (local_300->initial).raw;
          }
          else if (uVar9 == 0xa0) {
            write_fifo((gba_apu_t *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08,uVar8);
          }
          else if (uVar9 == 0xa4) {
            write_fifo((gba_apu_t *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08,uVar8);
          }
          else {
            _Var3 = is_ioreg_writable(local_390);
            if (_Var3) {
              uVar1 = get_ioreg_size_for_addr(local_390);
              if (uVar1 != '\x04') {
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                        ,0x25f);
                fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
                        "Trying to get the address of a wrong-sized word ioreg");
                exit(1);
              }
              uVar9 = in_EDI & 0xffc;
              if (uVar9 == 0x28) {
                local_8 = (addr_27b_t *)&ppu->BG2X;
              }
              else if (uVar9 == 0x2c) {
                local_8 = (addr_27b_t *)&ppu->BG2Y;
              }
              else if (uVar9 == 0x38) {
                local_8 = (addr_27b_t *)&ppu->BG3X;
              }
              else if (uVar9 == 0x3c) {
                local_8 = (addr_27b_t *)&ppu->BG3Y;
              }
              else if ((uVar9 == 0xa0) || (uVar9 == 0xa4)) {
LAB_001478a7:
                local_8 = (addr_27b_t *)0x0;
              }
              else if (uVar9 == 0xb0) {
                local_8 = &bus->DMA0SAD;
              }
              else if (uVar9 == 0xb4) {
                local_8 = &bus->DMA0DAD;
              }
              else if (uVar9 == 0xbc) {
                local_8 = (addr_27b_t *)&bus->DMA1SAD;
              }
              else if (uVar9 == 0xc0) {
                local_8 = &bus->DMA1DAD;
              }
              else if (uVar9 == 200) {
                local_8 = (addr_27b_t *)&bus->DMA2SAD;
              }
              else if (uVar9 == 0xcc) {
                local_8 = &bus->DMA2DAD;
              }
              else if (uVar9 == 0xd4) {
                local_8 = (addr_27b_t *)&bus->DMA3SAD;
              }
              else {
                if (uVar9 != 0xd8) {
                  if (((uVar9 != 0x150) && (uVar9 != 0x154)) && (uVar9 != 0x800)) {
                    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                            ,0x273);
                    fprintf(_stderr,
                            "Tried to get the address of an unknown (but valid) word ioreg addr: 0x%08X\n\x1b[0;m"
                            ,(ulong)local_390);
                    exit(1);
                  }
                  goto LAB_001478a7;
                }
                local_8 = (addr_27b_t *)&bus->DMA3DAD;
              }
              if (local_8 == (addr_27b_t *)0x0) {
                if (gba_log_verbosity != 0) {
                  printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                         ,(ulong)local_390,0xff);
                }
              }
              else {
                local_8->raw = local_8->raw & 0xffffff00;
                local_8->raw = uVar6 | local_8->raw;
              }
            }
            else if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m",
                     (ulong)local_390);
            }
          }
        }
        else if ((in_EDI & 0xffc) == 0x300) {
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m");
          }
        }
        else {
          if ((in_EDI & 0xffc) != 0x301) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x141);
            fprintf(_stderr,
                    "Write to unknown (but valid) byte ioreg addr 0x%08X == 0x%02X\n\x1b[0;m",
                    (ulong)local_390,(ulong)bVar2);
            exit(1);
          }
          if ((in_ESI & 1) != 0) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x139);
            fprintf(_stderr,"Wrote to HALTCNT with bit 0 being 1\n\x1b[0;m");
            exit(1);
          }
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
          }
          cpu->halt = true;
        }
      }
      else if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m",
               (ulong)local_390);
      }
LAB_00147abd:
      uVar7 = local_390 + 1;
      bVar2 = (byte)(in_ESI >> 8);
      _Var3 = is_ioreg_writable(uVar7);
      if (_Var3) {
        uVar1 = get_ioreg_size_for_addr(uVar7);
        if (uVar1 == '\x02') {
          local_330 = (char)(uVar7 & 1);
          uVar4 = (ushort)bVar2 << (local_330 << 3);
          uVar9 = uVar7 - (uVar7 & 1);
          local_13c = (ushort)(0xff << (local_330 << 3));
          uVar6 = uVar9 & 0xfff;
          switch(uVar6) {
          case 0:
            local_c8 = (gba_ppu_t *)&ppu->DISPCNT;
            break;
          default:
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x1ce);
            fprintf(_stderr,"Access to unknown (but valid) half ioreg addr 0x%08X\n\x1b[0;m",
                    (ulong)uVar9);
            exit(1);
          case 2:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
            }
            local_c8 = (gba_ppu_t *)0x0;
            break;
          case 4:
            local_c8 = (gba_ppu_t *)&ppu->DISPSTAT;
            break;
          case 6:
            local_c8 = ppu;
            break;
          case 8:
            local_c8 = (gba_ppu_t *)&ppu->BG0CNT;
            break;
          case 10:
            local_c8 = (gba_ppu_t *)&ppu->BG1CNT;
            break;
          case 0xc:
            local_c8 = (gba_ppu_t *)&ppu->BG2CNT;
            break;
          case 0xe:
            local_c8 = (gba_ppu_t *)&ppu->BG3CNT;
            break;
          case 0x10:
            local_c8 = (gba_ppu_t *)&ppu->BG0HOFS;
            break;
          case 0x12:
            local_c8 = (gba_ppu_t *)&ppu->BG0VOFS;
            break;
          case 0x14:
            local_c8 = (gba_ppu_t *)&ppu->BG1HOFS;
            break;
          case 0x16:
            local_c8 = (gba_ppu_t *)&ppu->BG1VOFS;
            break;
          case 0x18:
            local_c8 = (gba_ppu_t *)&ppu->BG2HOFS;
            break;
          case 0x1a:
            local_c8 = (gba_ppu_t *)&ppu->BG2VOFS;
            break;
          case 0x1c:
            local_c8 = (gba_ppu_t *)&ppu->BG3HOFS;
            break;
          case 0x1e:
            local_c8 = (gba_ppu_t *)&ppu->BG3VOFS;
            break;
          case 0x20:
            local_c8 = (gba_ppu_t *)&ppu->BG2PA;
            break;
          case 0x22:
            local_c8 = (gba_ppu_t *)&ppu->BG2PB;
            break;
          case 0x24:
            local_c8 = (gba_ppu_t *)&ppu->BG2PC;
            break;
          case 0x26:
            local_c8 = (gba_ppu_t *)&ppu->BG2PD;
            break;
          case 0x30:
            local_c8 = (gba_ppu_t *)&ppu->BG3PA;
            break;
          case 0x32:
            local_c8 = (gba_ppu_t *)&ppu->BG3PB;
            break;
          case 0x34:
            local_c8 = (gba_ppu_t *)&ppu->BG3PC;
            break;
          case 0x36:
            local_c8 = (gba_ppu_t *)&ppu->BG3PD;
            break;
          case 0x40:
            local_c8 = (gba_ppu_t *)&ppu->WIN0H;
            break;
          case 0x42:
            local_c8 = (gba_ppu_t *)&ppu->WIN1H;
            break;
          case 0x44:
            local_c8 = (gba_ppu_t *)&ppu->WIN0V;
            break;
          case 0x46:
            local_c8 = (gba_ppu_t *)&ppu->WIN1V;
            break;
          case 0x48:
            local_c8 = (gba_ppu_t *)&ppu->WININ;
            break;
          case 0x4a:
            local_c8 = (gba_ppu_t *)&ppu->WINOUT;
            break;
          case 0x4c:
            local_c8 = (gba_ppu_t *)&ppu->MOSAIC;
            break;
          case 0x50:
            local_c8 = (gba_ppu_t *)&ppu->BLDCNT;
            break;
          case 0x52:
            local_c8 = (gba_ppu_t *)&ppu->BLDALPHA;
            break;
          case 0x54:
            local_c8 = (gba_ppu_t *)&ppu->BLDY;
            break;
          case 0x60:
          case 0x62:
          case 100:
          case 0x68:
          case 0x6c:
          case 0x70:
          case 0x72:
          case 0x74:
          case 0x78:
          case 0x7c:
          case 0x80:
          case 0x82:
          case 0x84:
          case 0x90:
          case 0x92:
          case 0x94:
          case 0x96:
          case 0x98:
          case 0x9a:
          case 0x9c:
          case 0x9e:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m",
                     (ulong)uVar6);
            }
            local_c8 = (gba_ppu_t *)0x0;
            break;
          case 0x88:
            local_c8 = (gba_ppu_t *)&bus->SOUNDBIAS;
            break;
          case 0xb8:
            local_c8 = (gba_ppu_t *)&bus->DMA0CNT_L;
            break;
          case 0xba:
            local_c8 = (gba_ppu_t *)&bus->DMA0CNT_H;
            break;
          case 0xc4:
            local_c8 = (gba_ppu_t *)&bus->DMA1CNT_L;
            break;
          case 0xc6:
            local_c8 = (gba_ppu_t *)&bus->DMA1CNT_H;
            break;
          case 0xd0:
            local_c8 = (gba_ppu_t *)&bus->DMA2CNT_L;
            break;
          case 0xd2:
            local_c8 = (gba_ppu_t *)&bus->DMA2CNT_H;
            break;
          case 0xdc:
            local_c8 = (gba_ppu_t *)&bus->DMA3CNT_L;
            break;
          case 0xde:
            local_c8 = (gba_ppu_t *)&bus->DMA3CNT_H;
            break;
          case 0x100:
            local_c8 = (gba_ppu_t *)bus->TMCNT_L;
            break;
          case 0x102:
            local_c8 = (gba_ppu_t *)bus->TMCNT_H;
            break;
          case 0x104:
            local_c8 = (gba_ppu_t *)(bus->TMCNT_L + 1);
            break;
          case 0x106:
            local_c8 = (gba_ppu_t *)(bus->TMCNT_H + 1);
            break;
          case 0x108:
            local_c8 = (gba_ppu_t *)(bus->TMCNT_L + 2);
            break;
          case 0x10a:
            local_c8 = (gba_ppu_t *)(bus->TMCNT_H + 2);
            break;
          case 0x10c:
            local_c8 = (gba_ppu_t *)(bus->TMCNT_L + 3);
            break;
          case 0x10e:
            local_c8 = (gba_ppu_t *)(bus->TMCNT_H + 3);
            break;
          case 0x120:
          case 0x122:
          case 0x124:
          case 0x126:
          case 0x128:
          case 0x12a:
          case 0x150:
          case 0x154:
          case 0x158:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m",
                     (ulong)uVar6);
            }
            local_c8 = (gba_ppu_t *)0x0;
            break;
          case 0x130:
            local_c8 = (gba_ppu_t *)&bus->KEYINPUT;
            break;
          case 0x132:
            local_c8 = (gba_ppu_t *)&bus->KEYCNT;
            break;
          case 0x134:
            local_c8 = (gba_ppu_t *)&bus->RCNT;
            break;
          case 0x140:
            local_c8 = (gba_ppu_t *)&bus->JOYCNT;
            break;
          case 0x200:
            local_c8 = (gba_ppu_t *)&bus->interrupt_enable;
            break;
          case 0x202:
            local_c8 = (gba_ppu_t *)&bus->IF;
            break;
          case 0x204:
            local_c8 = (gba_ppu_t *)&bus->WAITCNT;
            break;
          case 0x208:
            local_c8 = (gba_ppu_t *)bus;
          }
          if (local_c8 == (gba_ppu_t *)0x0) {
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m",(ulong)uVar9)
              ;
            }
          }
          else {
            uVar6 = uVar9 & 0xfff;
            if (uVar6 == 4) {
              local_13c = local_13c & 0xfff8;
            }
            else {
              if (uVar6 == 0x202) {
                (bus->IF).raw = (bus->IF).raw & (uVar4 ^ 0xffff);
                goto LAB_0014905a;
              }
              if (uVar6 == 0x208) {
                local_13c = 1;
              }
            }
            uVar12 = local_c8->y;
            local_c8->y = local_c8->y & ~local_13c;
            local_c8->y = local_c8->y | uVar4 & local_13c;
            uVar9 = uVar9 & 0xfff;
            if (uVar9 == 0xb8) {
LAB_001486f5:
              gba_dma();
            }
            else if (uVar9 == 0xba) {
              if (-1 < (short)(bus->DMA0CNT_H).raw) {
                (bus->DMA0INT).previously_enabled = false;
              }
              gba_dma();
            }
            else {
              if (uVar9 == 0xc4) goto LAB_001486f5;
              if (uVar9 == 0xc6) {
                if (-1 < (short)(bus->DMA1CNT_H).raw) {
                  (bus->DMA1INT).previously_enabled = false;
                }
                gba_dma();
              }
              else {
                if (uVar9 == 0xd0) goto LAB_001486f5;
                if (uVar9 == 0xd2) {
                  if (-1 < (short)(bus->DMA2CNT_H).raw) {
                    (bus->DMA2INT).previously_enabled = false;
                  }
                  gba_dma();
                }
                else {
                  if (uVar9 == 0xdc) goto LAB_001486f5;
                  if (uVar9 == 0xde) {
                    if (-1 < (short)(bus->DMA3CNT_H).raw) {
                      (bus->DMA3INT).previously_enabled = false;
                    }
                    gba_dma();
                  }
                  else if (uVar9 == 0x102) {
                    tmcnth_write(0,uVar12);
                  }
                  else if (uVar9 == 0x106) {
                    tmcnth_write(1,uVar12);
                  }
                  else if (uVar9 == 0x10a) {
                    tmcnth_write(2,uVar12);
                  }
                  else if (uVar9 == 0x10e) {
                    tmcnth_write(3,uVar12);
                  }
                  else if (uVar9 == 0x204) {
                    on_waitcnt_updated();
                  }
                }
              }
            }
          }
        }
        else if (uVar1 == '\x04') {
          local_338 = (char)(uVar7 & 3);
          uVar6 = (uint)bVar2 << (local_338 << 3);
          uVar10 = uVar7 - (uVar7 & 3);
          uVar9 = 0xff << (local_338 << 3);
          uVar5 = uVar10 & 0xfff;
          if ((((uVar5 == 0x28) || (uVar5 == 0x2c)) || (uVar5 == 0x38)) || (uVar5 == 0x3c)) {
            switch(uVar5) {
            case 0x28:
              local_2d0 = &(ppu->BG2X).current;
              local_2d8 = &ppu->BG2X;
              break;
            default:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                      ,0x298);
              fprintf(_stderr,"Fatal error- should not have ended up here.\n\x1b[0;m");
              exit(1);
            case 0x2c:
              local_2d0 = &(ppu->BG2Y).current;
              local_2d8 = &ppu->BG2Y;
              break;
            case 0x38:
              local_2d0 = &(ppu->BG3X).current;
              local_2d8 = &ppu->BG3X;
              break;
            case 0x3c:
              local_2d0 = &(ppu->BG3Y).current;
              local_2d8 = &ppu->BG3Y;
            }
            bVar11 = false;
            if (0xa0 < ppu->y) {
              bVar11 = ppu->y != 0xe3;
            }
            if (!bVar11) {
              local_2d0->raw = (uVar9 ^ 0xffffffff) & local_2d0->raw;
              local_2d0->raw = uVar6 & uVar9 | local_2d0->raw;
            }
            (local_2d8->initial).raw = (uVar9 ^ 0xffffffff) & (local_2d8->initial).raw;
            (local_2d8->initial).raw = uVar6 & uVar9 | (local_2d8->initial).raw;
          }
          else if (uVar5 == 0xa0) {
            write_fifo((gba_apu_t *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08,uVar8);
          }
          else if (uVar5 == 0xa4) {
            write_fifo((gba_apu_t *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08,uVar8);
          }
          else {
            _Var3 = is_ioreg_writable(uVar10);
            if (_Var3) {
              uVar1 = get_ioreg_size_for_addr(uVar10);
              if (uVar1 != '\x04') {
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                        ,0x25f);
                fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
                        "Trying to get the address of a wrong-sized word ioreg");
                exit(1);
              }
              uVar5 = uVar10 & 0xfff;
              if (uVar5 == 0x28) {
                local_18 = (addr_27b_t *)&ppu->BG2X;
              }
              else if (uVar5 == 0x2c) {
                local_18 = (addr_27b_t *)&ppu->BG2Y;
              }
              else if (uVar5 == 0x38) {
                local_18 = (addr_27b_t *)&ppu->BG3X;
              }
              else if (uVar5 == 0x3c) {
                local_18 = (addr_27b_t *)&ppu->BG3Y;
              }
              else if ((uVar5 == 0xa0) || (uVar5 == 0xa4)) {
LAB_00148e44:
                local_18 = (addr_27b_t *)0x0;
              }
              else if (uVar5 == 0xb0) {
                local_18 = &bus->DMA0SAD;
              }
              else if (uVar5 == 0xb4) {
                local_18 = &bus->DMA0DAD;
              }
              else if (uVar5 == 0xbc) {
                local_18 = (addr_27b_t *)&bus->DMA1SAD;
              }
              else if (uVar5 == 0xc0) {
                local_18 = &bus->DMA1DAD;
              }
              else if (uVar5 == 200) {
                local_18 = (addr_27b_t *)&bus->DMA2SAD;
              }
              else if (uVar5 == 0xcc) {
                local_18 = &bus->DMA2DAD;
              }
              else if (uVar5 == 0xd4) {
                local_18 = (addr_27b_t *)&bus->DMA3SAD;
              }
              else {
                if (uVar5 != 0xd8) {
                  if (((uVar5 != 0x150) && (uVar5 != 0x154)) && (uVar5 != 0x800)) {
                    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                            ,0x273);
                    fprintf(_stderr,
                            "Tried to get the address of an unknown (but valid) word ioreg addr: 0x%08X\n\x1b[0;m"
                            ,(ulong)uVar10);
                    exit(1);
                  }
                  goto LAB_00148e44;
                }
                local_18 = (addr_27b_t *)&bus->DMA3DAD;
              }
              if (local_18 == (addr_27b_t *)0x0) {
                if (gba_log_verbosity != 0) {
                  printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                         ,(ulong)uVar10,(ulong)uVar9);
                }
              }
              else {
                local_18->raw = (uVar9 ^ 0xffffffff) & local_18->raw;
                local_18->raw = uVar6 & uVar9 | local_18->raw;
              }
            }
            else if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m",
                     (ulong)uVar10);
            }
          }
        }
        else if ((uVar7 & 0xfff) == 0x300) {
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m");
          }
        }
        else {
          if ((uVar7 & 0xfff) != 0x301) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x141);
            fprintf(_stderr,
                    "Write to unknown (but valid) byte ioreg addr 0x%08X == 0x%02X\n\x1b[0;m",
                    (ulong)uVar7,(ulong)bVar2);
            exit(1);
          }
          if ((in_ESI & 0x100) != 0) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x139);
            fprintf(_stderr,"Wrote to HALTCNT with bit 0 being 1\n\x1b[0;m");
            exit(1);
          }
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
          }
          cpu->halt = true;
        }
      }
      else if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m",
               (ulong)uVar7);
      }
LAB_0014905a:
      uVar7 = local_390 + 2;
      bVar2 = (byte)(in_ESI >> 0x10);
      _Var3 = is_ioreg_writable(uVar7);
      if (_Var3) {
        uVar1 = get_ioreg_size_for_addr(uVar7);
        if (uVar1 == '\x02') {
          local_124 = 0xff;
          uVar6 = uVar7 & 0xfff;
          switch(uVar6) {
          case 0:
            local_e0 = (gba_ppu_t *)&ppu->DISPCNT;
            break;
          case 2:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
            }
            local_e0 = (gba_ppu_t *)0x0;
            break;
          case 4:
            local_e0 = (gba_ppu_t *)&ppu->DISPSTAT;
            break;
          case 6:
            local_e0 = ppu;
            break;
          case 8:
            local_e0 = (gba_ppu_t *)&ppu->BG0CNT;
            break;
          case 10:
            local_e0 = (gba_ppu_t *)&ppu->BG1CNT;
            break;
          case 0xc:
            local_e0 = (gba_ppu_t *)&ppu->BG2CNT;
            break;
          case 0xe:
            local_e0 = (gba_ppu_t *)&ppu->BG3CNT;
            break;
          case 0x10:
            local_e0 = (gba_ppu_t *)&ppu->BG0HOFS;
            break;
          case 0x12:
            local_e0 = (gba_ppu_t *)&ppu->BG0VOFS;
            break;
          case 0x14:
            local_e0 = (gba_ppu_t *)&ppu->BG1HOFS;
            break;
          case 0x16:
            local_e0 = (gba_ppu_t *)&ppu->BG1VOFS;
            break;
          case 0x18:
            local_e0 = (gba_ppu_t *)&ppu->BG2HOFS;
            break;
          case 0x1a:
            local_e0 = (gba_ppu_t *)&ppu->BG2VOFS;
            break;
          case 0x1c:
            local_e0 = (gba_ppu_t *)&ppu->BG3HOFS;
            break;
          case 0x1e:
            local_e0 = (gba_ppu_t *)&ppu->BG3VOFS;
            break;
          case 0x20:
            local_e0 = (gba_ppu_t *)&ppu->BG2PA;
            break;
          case 0x22:
            local_e0 = (gba_ppu_t *)&ppu->BG2PB;
            break;
          case 0x24:
            local_e0 = (gba_ppu_t *)&ppu->BG2PC;
            break;
          case 0x26:
            local_e0 = (gba_ppu_t *)&ppu->BG2PD;
            break;
          default:
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x1ce);
            fprintf(_stderr,"Access to unknown (but valid) half ioreg addr 0x%08X\n\x1b[0;m",
                    (ulong)uVar7);
            exit(1);
          case 0x30:
            local_e0 = (gba_ppu_t *)&ppu->BG3PA;
            break;
          case 0x32:
            local_e0 = (gba_ppu_t *)&ppu->BG3PB;
            break;
          case 0x34:
            local_e0 = (gba_ppu_t *)&ppu->BG3PC;
            break;
          case 0x36:
            local_e0 = (gba_ppu_t *)&ppu->BG3PD;
            break;
          case 0x40:
            local_e0 = (gba_ppu_t *)&ppu->WIN0H;
            break;
          case 0x42:
            local_e0 = (gba_ppu_t *)&ppu->WIN1H;
            break;
          case 0x44:
            local_e0 = (gba_ppu_t *)&ppu->WIN0V;
            break;
          case 0x46:
            local_e0 = (gba_ppu_t *)&ppu->WIN1V;
            break;
          case 0x48:
            local_e0 = (gba_ppu_t *)&ppu->WININ;
            break;
          case 0x4a:
            local_e0 = (gba_ppu_t *)&ppu->WINOUT;
            break;
          case 0x4c:
            local_e0 = (gba_ppu_t *)&ppu->MOSAIC;
            break;
          case 0x50:
            local_e0 = (gba_ppu_t *)&ppu->BLDCNT;
            break;
          case 0x52:
            local_e0 = (gba_ppu_t *)&ppu->BLDALPHA;
            break;
          case 0x54:
            local_e0 = (gba_ppu_t *)&ppu->BLDY;
            break;
          case 0x60:
          case 0x62:
          case 100:
          case 0x68:
          case 0x6c:
          case 0x70:
          case 0x72:
          case 0x74:
          case 0x78:
          case 0x7c:
          case 0x80:
          case 0x82:
          case 0x84:
          case 0x90:
          case 0x92:
          case 0x94:
          case 0x96:
          case 0x98:
          case 0x9a:
          case 0x9c:
          case 0x9e:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m",
                     (ulong)uVar6);
            }
            local_e0 = (gba_ppu_t *)0x0;
            break;
          case 0x88:
            local_e0 = (gba_ppu_t *)&bus->SOUNDBIAS;
            break;
          case 0xb8:
            local_e0 = (gba_ppu_t *)&bus->DMA0CNT_L;
            break;
          case 0xba:
            local_e0 = (gba_ppu_t *)&bus->DMA0CNT_H;
            break;
          case 0xc4:
            local_e0 = (gba_ppu_t *)&bus->DMA1CNT_L;
            break;
          case 0xc6:
            local_e0 = (gba_ppu_t *)&bus->DMA1CNT_H;
            break;
          case 0xd0:
            local_e0 = (gba_ppu_t *)&bus->DMA2CNT_L;
            break;
          case 0xd2:
            local_e0 = (gba_ppu_t *)&bus->DMA2CNT_H;
            break;
          case 0xdc:
            local_e0 = (gba_ppu_t *)&bus->DMA3CNT_L;
            break;
          case 0xde:
            local_e0 = (gba_ppu_t *)&bus->DMA3CNT_H;
            break;
          case 0x100:
            local_e0 = (gba_ppu_t *)bus->TMCNT_L;
            break;
          case 0x102:
            local_e0 = (gba_ppu_t *)bus->TMCNT_H;
            break;
          case 0x104:
            local_e0 = (gba_ppu_t *)(bus->TMCNT_L + 1);
            break;
          case 0x106:
            local_e0 = (gba_ppu_t *)(bus->TMCNT_H + 1);
            break;
          case 0x108:
            local_e0 = (gba_ppu_t *)(bus->TMCNT_L + 2);
            break;
          case 0x10a:
            local_e0 = (gba_ppu_t *)(bus->TMCNT_H + 2);
            break;
          case 0x10c:
            local_e0 = (gba_ppu_t *)(bus->TMCNT_L + 3);
            break;
          case 0x10e:
            local_e0 = (gba_ppu_t *)(bus->TMCNT_H + 3);
            break;
          case 0x120:
          case 0x122:
          case 0x124:
          case 0x126:
          case 0x128:
          case 0x12a:
          case 0x150:
          case 0x154:
          case 0x158:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m",
                     (ulong)uVar6);
            }
            local_e0 = (gba_ppu_t *)0x0;
            break;
          case 0x130:
            local_e0 = (gba_ppu_t *)&bus->KEYINPUT;
            break;
          case 0x132:
            local_e0 = (gba_ppu_t *)&bus->KEYCNT;
            break;
          case 0x134:
            local_e0 = (gba_ppu_t *)&bus->RCNT;
            break;
          case 0x140:
            local_e0 = (gba_ppu_t *)&bus->JOYCNT;
            break;
          case 0x200:
            local_e0 = (gba_ppu_t *)&bus->interrupt_enable;
            break;
          case 0x202:
            local_e0 = (gba_ppu_t *)&bus->IF;
            break;
          case 0x204:
            local_e0 = (gba_ppu_t *)&bus->WAITCNT;
            break;
          case 0x208:
            local_e0 = (gba_ppu_t *)bus;
          }
          if (local_e0 == (gba_ppu_t *)0x0) {
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m",(ulong)uVar7)
              ;
            }
          }
          else {
            uVar6 = uVar7 & 0xfff;
            if (uVar6 == 4) {
              local_124 = 0xf8;
            }
            else {
              if (uVar6 == 0x202) {
                (bus->IF).raw = (bus->IF).raw & (bVar2 ^ 0xffff);
                goto LAB_0014a5f7;
              }
              if (uVar6 == 0x208) {
                local_124 = 1;
              }
            }
            uVar12 = local_e0->y;
            local_e0->y = local_e0->y & ~local_124;
            local_e0->y = local_e0->y | bVar2 & local_124;
            uVar6 = uVar7 & 0xfff;
            if (uVar6 == 0xb8) {
LAB_00149c92:
              gba_dma();
            }
            else if (uVar6 == 0xba) {
              if (-1 < (short)(bus->DMA0CNT_H).raw) {
                (bus->DMA0INT).previously_enabled = false;
              }
              gba_dma();
            }
            else {
              if (uVar6 == 0xc4) goto LAB_00149c92;
              if (uVar6 == 0xc6) {
                if (-1 < (short)(bus->DMA1CNT_H).raw) {
                  (bus->DMA1INT).previously_enabled = false;
                }
                gba_dma();
              }
              else {
                if (uVar6 == 0xd0) goto LAB_00149c92;
                if (uVar6 == 0xd2) {
                  if (-1 < (short)(bus->DMA2CNT_H).raw) {
                    (bus->DMA2INT).previously_enabled = false;
                  }
                  gba_dma();
                }
                else {
                  if (uVar6 == 0xdc) goto LAB_00149c92;
                  if (uVar6 == 0xde) {
                    if (-1 < (short)(bus->DMA3CNT_H).raw) {
                      (bus->DMA3INT).previously_enabled = false;
                    }
                    gba_dma();
                  }
                  else if (uVar6 == 0x102) {
                    tmcnth_write(0,uVar12);
                  }
                  else if (uVar6 == 0x106) {
                    tmcnth_write(1,uVar12);
                  }
                  else if (uVar6 == 0x10a) {
                    tmcnth_write(2,uVar12);
                  }
                  else if (uVar6 == 0x10e) {
                    tmcnth_write(3,uVar12);
                  }
                  else if (uVar6 == 0x204) {
                    on_waitcnt_updated();
                  }
                }
              }
            }
          }
        }
        else if (uVar1 == '\x04') {
          local_354 = (char)(uVar7 & 3);
          uVar6 = (uint)bVar2 << (local_354 << 3);
          uVar10 = uVar7 - (uVar7 & 3);
          uVar9 = 0xff << (local_354 << 3);
          uVar5 = uVar10 & 0xfff;
          if ((((uVar5 == 0x28) || (uVar5 == 0x2c)) || (uVar5 == 0x38)) || (uVar5 == 0x3c)) {
            switch(uVar5) {
            case 0x28:
              local_2a8 = &(ppu->BG2X).current;
              local_2b0 = &ppu->BG2X;
              break;
            default:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                      ,0x298);
              fprintf(_stderr,"Fatal error- should not have ended up here.\n\x1b[0;m");
              exit(1);
            case 0x2c:
              local_2a8 = &(ppu->BG2Y).current;
              local_2b0 = &ppu->BG2Y;
              break;
            case 0x38:
              local_2a8 = &(ppu->BG3X).current;
              local_2b0 = &ppu->BG3X;
              break;
            case 0x3c:
              local_2a8 = &(ppu->BG3Y).current;
              local_2b0 = &ppu->BG3Y;
            }
            bVar11 = false;
            if (0xa0 < ppu->y) {
              bVar11 = ppu->y != 0xe3;
            }
            if (!bVar11) {
              local_2a8->raw = (uVar9 ^ 0xffffffff) & local_2a8->raw;
              local_2a8->raw = uVar6 & uVar9 | local_2a8->raw;
            }
            (local_2b0->initial).raw = (uVar9 ^ 0xffffffff) & (local_2b0->initial).raw;
            (local_2b0->initial).raw = uVar6 & uVar9 | (local_2b0->initial).raw;
          }
          else if (uVar5 == 0xa0) {
            write_fifo((gba_apu_t *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08,uVar8);
          }
          else if (uVar5 == 0xa4) {
            write_fifo((gba_apu_t *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08,uVar8);
          }
          else {
            _Var3 = is_ioreg_writable(uVar10);
            if (_Var3) {
              uVar1 = get_ioreg_size_for_addr(uVar10);
              if (uVar1 != '\x04') {
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                        ,0x25f);
                fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
                        "Trying to get the address of a wrong-sized word ioreg");
                exit(1);
              }
              uVar5 = uVar10 & 0xfff;
              if (uVar5 == 0x28) {
                local_28 = (addr_27b_t *)&ppu->BG2X;
              }
              else if (uVar5 == 0x2c) {
                local_28 = (addr_27b_t *)&ppu->BG2Y;
              }
              else if (uVar5 == 0x38) {
                local_28 = (addr_27b_t *)&ppu->BG3X;
              }
              else if (uVar5 == 0x3c) {
                local_28 = (addr_27b_t *)&ppu->BG3Y;
              }
              else if ((uVar5 == 0xa0) || (uVar5 == 0xa4)) {
LAB_0014a3e1:
                local_28 = (addr_27b_t *)0x0;
              }
              else if (uVar5 == 0xb0) {
                local_28 = &bus->DMA0SAD;
              }
              else if (uVar5 == 0xb4) {
                local_28 = &bus->DMA0DAD;
              }
              else if (uVar5 == 0xbc) {
                local_28 = (addr_27b_t *)&bus->DMA1SAD;
              }
              else if (uVar5 == 0xc0) {
                local_28 = &bus->DMA1DAD;
              }
              else if (uVar5 == 200) {
                local_28 = (addr_27b_t *)&bus->DMA2SAD;
              }
              else if (uVar5 == 0xcc) {
                local_28 = &bus->DMA2DAD;
              }
              else if (uVar5 == 0xd4) {
                local_28 = (addr_27b_t *)&bus->DMA3SAD;
              }
              else {
                if (uVar5 != 0xd8) {
                  if (((uVar5 != 0x150) && (uVar5 != 0x154)) && (uVar5 != 0x800)) {
                    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                            ,0x273);
                    fprintf(_stderr,
                            "Tried to get the address of an unknown (but valid) word ioreg addr: 0x%08X\n\x1b[0;m"
                            ,(ulong)uVar10);
                    exit(1);
                  }
                  goto LAB_0014a3e1;
                }
                local_28 = (addr_27b_t *)&bus->DMA3DAD;
              }
              if (local_28 == (addr_27b_t *)0x0) {
                if (gba_log_verbosity != 0) {
                  printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                         ,(ulong)uVar10,(ulong)uVar9);
                }
              }
              else {
                local_28->raw = (uVar9 ^ 0xffffffff) & local_28->raw;
                local_28->raw = uVar6 & uVar9 | local_28->raw;
              }
            }
            else if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m",
                     (ulong)uVar10);
            }
          }
        }
        else if ((uVar7 & 0xfff) == 0x300) {
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m");
          }
        }
        else {
          if ((uVar7 & 0xfff) != 0x301) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x141);
            fprintf(_stderr,
                    "Write to unknown (but valid) byte ioreg addr 0x%08X == 0x%02X\n\x1b[0;m",
                    (ulong)uVar7,(ulong)bVar2);
            exit(1);
          }
          if ((in_ESI & 0x10000) != 0) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x139);
            fprintf(_stderr,"Wrote to HALTCNT with bit 0 being 1\n\x1b[0;m");
            exit(1);
          }
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
          }
          cpu->halt = true;
        }
      }
      else if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m",
               (ulong)uVar7);
      }
LAB_0014a5f7:
      uVar7 = local_390 + 3;
      bVar2 = (byte)(in_ESI >> 0x18);
      _Var3 = is_ioreg_writable(uVar7);
      if (_Var3) {
        uVar1 = get_ioreg_size_for_addr(uVar7);
        if (uVar1 == '\x02') {
          local_368 = (char)(uVar7 & 1);
          uVar4 = (ushort)bVar2 << (local_368 << 3);
          uVar9 = uVar7 - (uVar7 & 1);
          local_10c = (ushort)(0xff << (local_368 << 3));
          uVar6 = uVar9 & 0xfff;
          switch(uVar6) {
          case 0:
            local_f8 = (gba_ppu_t *)&ppu->DISPCNT;
            break;
          default:
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x1ce);
            fprintf(_stderr,"Access to unknown (but valid) half ioreg addr 0x%08X\n\x1b[0;m",
                    (ulong)uVar9);
            exit(1);
          case 2:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
            }
            local_f8 = (gba_ppu_t *)0x0;
            break;
          case 4:
            local_f8 = (gba_ppu_t *)&ppu->DISPSTAT;
            break;
          case 6:
            local_f8 = ppu;
            break;
          case 8:
            local_f8 = (gba_ppu_t *)&ppu->BG0CNT;
            break;
          case 10:
            local_f8 = (gba_ppu_t *)&ppu->BG1CNT;
            break;
          case 0xc:
            local_f8 = (gba_ppu_t *)&ppu->BG2CNT;
            break;
          case 0xe:
            local_f8 = (gba_ppu_t *)&ppu->BG3CNT;
            break;
          case 0x10:
            local_f8 = (gba_ppu_t *)&ppu->BG0HOFS;
            break;
          case 0x12:
            local_f8 = (gba_ppu_t *)&ppu->BG0VOFS;
            break;
          case 0x14:
            local_f8 = (gba_ppu_t *)&ppu->BG1HOFS;
            break;
          case 0x16:
            local_f8 = (gba_ppu_t *)&ppu->BG1VOFS;
            break;
          case 0x18:
            local_f8 = (gba_ppu_t *)&ppu->BG2HOFS;
            break;
          case 0x1a:
            local_f8 = (gba_ppu_t *)&ppu->BG2VOFS;
            break;
          case 0x1c:
            local_f8 = (gba_ppu_t *)&ppu->BG3HOFS;
            break;
          case 0x1e:
            local_f8 = (gba_ppu_t *)&ppu->BG3VOFS;
            break;
          case 0x20:
            local_f8 = (gba_ppu_t *)&ppu->BG2PA;
            break;
          case 0x22:
            local_f8 = (gba_ppu_t *)&ppu->BG2PB;
            break;
          case 0x24:
            local_f8 = (gba_ppu_t *)&ppu->BG2PC;
            break;
          case 0x26:
            local_f8 = (gba_ppu_t *)&ppu->BG2PD;
            break;
          case 0x30:
            local_f8 = (gba_ppu_t *)&ppu->BG3PA;
            break;
          case 0x32:
            local_f8 = (gba_ppu_t *)&ppu->BG3PB;
            break;
          case 0x34:
            local_f8 = (gba_ppu_t *)&ppu->BG3PC;
            break;
          case 0x36:
            local_f8 = (gba_ppu_t *)&ppu->BG3PD;
            break;
          case 0x40:
            local_f8 = (gba_ppu_t *)&ppu->WIN0H;
            break;
          case 0x42:
            local_f8 = (gba_ppu_t *)&ppu->WIN1H;
            break;
          case 0x44:
            local_f8 = (gba_ppu_t *)&ppu->WIN0V;
            break;
          case 0x46:
            local_f8 = (gba_ppu_t *)&ppu->WIN1V;
            break;
          case 0x48:
            local_f8 = (gba_ppu_t *)&ppu->WININ;
            break;
          case 0x4a:
            local_f8 = (gba_ppu_t *)&ppu->WINOUT;
            break;
          case 0x4c:
            local_f8 = (gba_ppu_t *)&ppu->MOSAIC;
            break;
          case 0x50:
            local_f8 = (gba_ppu_t *)&ppu->BLDCNT;
            break;
          case 0x52:
            local_f8 = (gba_ppu_t *)&ppu->BLDALPHA;
            break;
          case 0x54:
            local_f8 = (gba_ppu_t *)&ppu->BLDY;
            break;
          case 0x60:
          case 0x62:
          case 100:
          case 0x68:
          case 0x6c:
          case 0x70:
          case 0x72:
          case 0x74:
          case 0x78:
          case 0x7c:
          case 0x80:
          case 0x82:
          case 0x84:
          case 0x90:
          case 0x92:
          case 0x94:
          case 0x96:
          case 0x98:
          case 0x9a:
          case 0x9c:
          case 0x9e:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m",
                     (ulong)uVar6);
            }
            local_f8 = (gba_ppu_t *)0x0;
            break;
          case 0x88:
            local_f8 = (gba_ppu_t *)&bus->SOUNDBIAS;
            break;
          case 0xb8:
            local_f8 = (gba_ppu_t *)&bus->DMA0CNT_L;
            break;
          case 0xba:
            local_f8 = (gba_ppu_t *)&bus->DMA0CNT_H;
            break;
          case 0xc4:
            local_f8 = (gba_ppu_t *)&bus->DMA1CNT_L;
            break;
          case 0xc6:
            local_f8 = (gba_ppu_t *)&bus->DMA1CNT_H;
            break;
          case 0xd0:
            local_f8 = (gba_ppu_t *)&bus->DMA2CNT_L;
            break;
          case 0xd2:
            local_f8 = (gba_ppu_t *)&bus->DMA2CNT_H;
            break;
          case 0xdc:
            local_f8 = (gba_ppu_t *)&bus->DMA3CNT_L;
            break;
          case 0xde:
            local_f8 = (gba_ppu_t *)&bus->DMA3CNT_H;
            break;
          case 0x100:
            local_f8 = (gba_ppu_t *)bus->TMCNT_L;
            break;
          case 0x102:
            local_f8 = (gba_ppu_t *)bus->TMCNT_H;
            break;
          case 0x104:
            local_f8 = (gba_ppu_t *)(bus->TMCNT_L + 1);
            break;
          case 0x106:
            local_f8 = (gba_ppu_t *)(bus->TMCNT_H + 1);
            break;
          case 0x108:
            local_f8 = (gba_ppu_t *)(bus->TMCNT_L + 2);
            break;
          case 0x10a:
            local_f8 = (gba_ppu_t *)(bus->TMCNT_H + 2);
            break;
          case 0x10c:
            local_f8 = (gba_ppu_t *)(bus->TMCNT_L + 3);
            break;
          case 0x10e:
            local_f8 = (gba_ppu_t *)(bus->TMCNT_H + 3);
            break;
          case 0x120:
          case 0x122:
          case 0x124:
          case 0x126:
          case 0x128:
          case 0x12a:
          case 0x150:
          case 0x154:
          case 0x158:
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m",
                     (ulong)uVar6);
            }
            local_f8 = (gba_ppu_t *)0x0;
            break;
          case 0x130:
            local_f8 = (gba_ppu_t *)&bus->KEYINPUT;
            break;
          case 0x132:
            local_f8 = (gba_ppu_t *)&bus->KEYCNT;
            break;
          case 0x134:
            local_f8 = (gba_ppu_t *)&bus->RCNT;
            break;
          case 0x140:
            local_f8 = (gba_ppu_t *)&bus->JOYCNT;
            break;
          case 0x200:
            local_f8 = (gba_ppu_t *)&bus->interrupt_enable;
            break;
          case 0x202:
            local_f8 = (gba_ppu_t *)&bus->IF;
            break;
          case 0x204:
            local_f8 = (gba_ppu_t *)&bus->WAITCNT;
            break;
          case 0x208:
            local_f8 = (gba_ppu_t *)bus;
          }
          if (local_f8 == (gba_ppu_t *)0x0) {
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m",(ulong)uVar9)
              ;
            }
          }
          else {
            uVar6 = uVar9 & 0xfff;
            if (uVar6 == 4) {
              local_10c = local_10c & 0xfff8;
            }
            else {
              if (uVar6 == 0x202) {
                (bus->IF).raw = (bus->IF).raw & (uVar4 ^ 0xffff);
                break;
              }
              if (uVar6 == 0x208) {
                local_10c = 1;
              }
            }
            uVar12 = local_f8->y;
            local_f8->y = local_f8->y & ~local_10c;
            local_f8->y = local_f8->y | uVar4 & local_10c;
            uVar9 = uVar9 & 0xfff;
            if (uVar9 == 0xb8) {
LAB_0014b1f9:
              gba_dma();
            }
            else if (uVar9 == 0xba) {
              if (-1 < (short)(bus->DMA0CNT_H).raw) {
                (bus->DMA0INT).previously_enabled = false;
              }
              gba_dma();
            }
            else {
              if (uVar9 == 0xc4) goto LAB_0014b1f9;
              if (uVar9 == 0xc6) {
                if (-1 < (short)(bus->DMA1CNT_H).raw) {
                  (bus->DMA1INT).previously_enabled = false;
                }
                gba_dma();
              }
              else {
                if (uVar9 == 0xd0) goto LAB_0014b1f9;
                if (uVar9 == 0xd2) {
                  if (-1 < (short)(bus->DMA2CNT_H).raw) {
                    (bus->DMA2INT).previously_enabled = false;
                  }
                  gba_dma();
                }
                else {
                  if (uVar9 == 0xdc) goto LAB_0014b1f9;
                  if (uVar9 == 0xde) {
                    if (-1 < (short)(bus->DMA3CNT_H).raw) {
                      (bus->DMA3INT).previously_enabled = false;
                    }
                    gba_dma();
                  }
                  else if (uVar9 == 0x102) {
                    tmcnth_write(0,uVar12);
                  }
                  else if (uVar9 == 0x106) {
                    tmcnth_write(1,uVar12);
                  }
                  else if (uVar9 == 0x10a) {
                    tmcnth_write(2,uVar12);
                  }
                  else if (uVar9 == 0x10e) {
                    tmcnth_write(3,uVar12);
                  }
                  else if (uVar9 == 0x204) {
                    on_waitcnt_updated();
                  }
                }
              }
            }
          }
        }
        else if (uVar1 == '\x04') {
          local_370 = (char)(uVar7 & 3);
          uVar6 = (uint)bVar2 << (local_370 << 3);
          uVar10 = uVar7 - (uVar7 & 3);
          uVar9 = 0xff << (local_370 << 3);
          uVar5 = uVar10 & 0xfff;
          if ((((uVar5 == 0x28) || (uVar5 == 0x2c)) || (uVar5 == 0x38)) || (uVar5 == 0x3c)) {
            switch(uVar5) {
            case 0x28:
              local_280 = &(ppu->BG2X).current;
              local_288 = &ppu->BG2X;
              break;
            default:
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                      ,0x298);
              fprintf(_stderr,"Fatal error- should not have ended up here.\n\x1b[0;m");
              exit(1);
            case 0x2c:
              local_280 = &(ppu->BG2Y).current;
              local_288 = &ppu->BG2Y;
              break;
            case 0x38:
              local_280 = &(ppu->BG3X).current;
              local_288 = &ppu->BG3X;
              break;
            case 0x3c:
              local_280 = &(ppu->BG3Y).current;
              local_288 = &ppu->BG3Y;
            }
            bVar11 = false;
            if (0xa0 < ppu->y) {
              bVar11 = ppu->y != 0xe3;
            }
            if (!bVar11) {
              local_280->raw = (uVar9 ^ 0xffffffff) & local_280->raw;
              local_280->raw = uVar6 & uVar9 | local_280->raw;
            }
            (local_288->initial).raw = (uVar9 ^ 0xffffffff) & (local_288->initial).raw;
            (local_288->initial).raw = uVar6 & uVar9 | (local_288->initial).raw;
          }
          else if (uVar5 == 0xa0) {
            write_fifo((gba_apu_t *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08,uVar8);
          }
          else if (uVar5 == 0xa4) {
            write_fifo((gba_apu_t *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08,uVar8);
          }
          else {
            _Var3 = is_ioreg_writable(uVar10);
            if (_Var3) {
              uVar1 = get_ioreg_size_for_addr(uVar10);
              if (uVar1 != '\x04') {
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                        ,0x25f);
                fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
                        "Trying to get the address of a wrong-sized word ioreg");
                exit(1);
              }
              uVar5 = uVar10 & 0xfff;
              if (uVar5 == 0x28) {
                local_38 = (addr_27b_t *)&ppu->BG2X;
              }
              else if (uVar5 == 0x2c) {
                local_38 = (addr_27b_t *)&ppu->BG2Y;
              }
              else if (uVar5 == 0x38) {
                local_38 = (addr_27b_t *)&ppu->BG3X;
              }
              else if (uVar5 == 0x3c) {
                local_38 = (addr_27b_t *)&ppu->BG3Y;
              }
              else if ((uVar5 == 0xa0) || (uVar5 == 0xa4)) {
LAB_0014b8ee:
                local_38 = (addr_27b_t *)0x0;
              }
              else if (uVar5 == 0xb0) {
                local_38 = &bus->DMA0SAD;
              }
              else if (uVar5 == 0xb4) {
                local_38 = &bus->DMA0DAD;
              }
              else if (uVar5 == 0xbc) {
                local_38 = (addr_27b_t *)&bus->DMA1SAD;
              }
              else if (uVar5 == 0xc0) {
                local_38 = &bus->DMA1DAD;
              }
              else if (uVar5 == 200) {
                local_38 = (addr_27b_t *)&bus->DMA2SAD;
              }
              else if (uVar5 == 0xcc) {
                local_38 = &bus->DMA2DAD;
              }
              else if (uVar5 == 0xd4) {
                local_38 = (addr_27b_t *)&bus->DMA3SAD;
              }
              else {
                if (uVar5 != 0xd8) {
                  if (((uVar5 != 0x150) && (uVar5 != 0x154)) && (uVar5 != 0x800)) {
                    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                            ,0x273);
                    fprintf(_stderr,
                            "Tried to get the address of an unknown (but valid) word ioreg addr: 0x%08X\n\x1b[0;m"
                            ,(ulong)uVar10);
                    exit(1);
                  }
                  goto LAB_0014b8ee;
                }
                local_38 = (addr_27b_t *)&bus->DMA3DAD;
              }
              if (local_38 == (addr_27b_t *)0x0) {
                if (gba_log_verbosity != 0) {
                  printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                         ,(ulong)uVar10,(ulong)uVar9);
                }
              }
              else {
                local_38->raw = (uVar9 ^ 0xffffffff) & local_38->raw;
                local_38->raw = uVar6 & uVar9 | local_38->raw;
              }
            }
            else if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m",
                     (ulong)uVar10);
            }
          }
        }
        else if ((uVar7 & 0xfff) == 0x300) {
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m");
          }
        }
        else {
          if ((uVar7 & 0xfff) != 0x301) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x141);
            fprintf(_stderr,
                    "Write to unknown (but valid) byte ioreg addr 0x%08X == 0x%02X\n\x1b[0;m",
                    (ulong)uVar7,(ulong)bVar2);
            exit(1);
          }
          if ((in_ESI & 0x1000000) != 0) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x139);
            fprintf(_stderr,"Wrote to HALTCNT with bit 0 being 1\n\x1b[0;m");
            exit(1);
          }
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
          }
          cpu->halt = true;
        }
      }
      else if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m",
               (ulong)uVar7);
      }
      break;
    case '\x02':
      _Var3 = is_ioreg_writable(local_390);
      if (_Var3) {
        local_184 = 0xffff;
        uVar6 = in_EDI & 0xffc;
        switch(uVar6) {
        case 0:
          local_80 = (gbabus_t *)&ppu->DISPCNT;
          break;
        case 4:
          local_80 = (gbabus_t *)&ppu->DISPSTAT;
          break;
        case 8:
          local_80 = (gbabus_t *)&ppu->BG0CNT;
          break;
        case 0xc:
          local_80 = (gbabus_t *)&ppu->BG2CNT;
          break;
        case 0x10:
          local_80 = (gbabus_t *)&ppu->BG0HOFS;
          break;
        case 0x14:
          local_80 = (gbabus_t *)&ppu->BG1HOFS;
          break;
        case 0x18:
          local_80 = (gbabus_t *)&ppu->BG2HOFS;
          break;
        case 0x1c:
          local_80 = (gbabus_t *)&ppu->BG3HOFS;
          break;
        case 0x20:
          local_80 = (gbabus_t *)&ppu->BG2PA;
          break;
        case 0x24:
          local_80 = (gbabus_t *)&ppu->BG2PC;
          break;
        default:
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                  ,0x1ce);
          fprintf(_stderr,"Access to unknown (but valid) half ioreg addr 0x%08X\n\x1b[0;m",
                  (ulong)local_390);
          exit(1);
        case 0x30:
          local_80 = (gbabus_t *)&ppu->BG3PA;
          break;
        case 0x34:
          local_80 = (gbabus_t *)&ppu->BG3PC;
          break;
        case 0x40:
          local_80 = (gbabus_t *)&ppu->WIN0H;
          break;
        case 0x44:
          local_80 = (gbabus_t *)&ppu->WIN0V;
          break;
        case 0x48:
          local_80 = (gbabus_t *)&ppu->WININ;
          break;
        case 0x4c:
          local_80 = (gbabus_t *)&ppu->MOSAIC;
          break;
        case 0x50:
          local_80 = (gbabus_t *)&ppu->BLDCNT;
          break;
        case 0x54:
          local_80 = (gbabus_t *)&ppu->BLDY;
          break;
        case 0x60:
        case 100:
        case 0x68:
        case 0x6c:
        case 0x70:
        case 0x74:
        case 0x78:
        case 0x7c:
        case 0x80:
        case 0x84:
        case 0x90:
        case 0x94:
        case 0x98:
        case 0x9c:
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m",
                   (ulong)uVar6);
          }
          local_80 = (gbabus_t *)0x0;
          break;
        case 0x88:
          local_80 = (gbabus_t *)&bus->SOUNDBIAS;
          break;
        case 0xb8:
          local_80 = (gbabus_t *)&bus->DMA0CNT_L;
          break;
        case 0xc4:
          local_80 = (gbabus_t *)&bus->DMA1CNT_L;
          break;
        case 0xd0:
          local_80 = (gbabus_t *)&bus->DMA2CNT_L;
          break;
        case 0xdc:
          local_80 = (gbabus_t *)&bus->DMA3CNT_L;
          break;
        case 0x100:
          local_80 = (gbabus_t *)bus->TMCNT_L;
          break;
        case 0x104:
          local_80 = (gbabus_t *)(bus->TMCNT_L + 1);
          break;
        case 0x108:
          local_80 = (gbabus_t *)(bus->TMCNT_L + 2);
          break;
        case 0x10c:
          local_80 = (gbabus_t *)(bus->TMCNT_L + 3);
          break;
        case 0x120:
        case 0x124:
        case 0x128:
        case 0x150:
        case 0x154:
        case 0x158:
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m",
                   (ulong)uVar6);
          }
          local_80 = (gbabus_t *)0x0;
          break;
        case 0x130:
          local_80 = (gbabus_t *)&bus->KEYINPUT;
          break;
        case 0x134:
          local_80 = (gbabus_t *)&bus->RCNT;
          break;
        case 0x140:
          local_80 = (gbabus_t *)&bus->JOYCNT;
          break;
        case 0x200:
          local_80 = (gbabus_t *)&bus->interrupt_enable;
          break;
        case 0x204:
          local_80 = (gbabus_t *)&bus->WAITCNT;
          break;
        case 0x208:
          local_80 = bus;
        }
        if (local_80 == (gbabus_t *)0x0) {
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m",
                   (ulong)local_390);
          }
        }
        else {
          uVar6 = in_EDI & 0xffc;
          if (uVar6 == 4) {
            local_184 = 0xfff8;
          }
          else {
            if (uVar6 == 0x202) {
              (bus->IF).raw = (bus->IF).raw & ((ushort)in_ESI ^ 0xffff);
              goto LAB_0014c6fd;
            }
            if (uVar6 == 0x208) {
              local_184 = 1;
            }
          }
          uVar12 = ((bg_rotation_scaling_t *)&local_80->interrupt_master_enable)->raw;
          ((bg_rotation_scaling_t *)&local_80->interrupt_master_enable)->raw =
               ((bg_rotation_scaling_t *)&local_80->interrupt_master_enable)->raw & ~local_184;
          ((bg_rotation_scaling_t *)&local_80->interrupt_master_enable)->raw =
               ((bg_rotation_scaling_t *)&local_80->interrupt_master_enable)->raw |
               (ushort)in_ESI & local_184;
          uVar6 = in_EDI & 0xffc;
          if (uVar6 == 0xb8) {
LAB_0014c67b:
            gba_dma();
          }
          else if (uVar6 == 0xba) {
            if (-1 < (short)(bus->DMA0CNT_H).raw) {
              (bus->DMA0INT).previously_enabled = false;
            }
            gba_dma();
          }
          else {
            if (uVar6 == 0xc4) goto LAB_0014c67b;
            if (uVar6 == 0xc6) {
              if (-1 < (short)(bus->DMA1CNT_H).raw) {
                (bus->DMA1INT).previously_enabled = false;
              }
              gba_dma();
            }
            else {
              if (uVar6 == 0xd0) goto LAB_0014c67b;
              if (uVar6 == 0xd2) {
                if (-1 < (short)(bus->DMA2CNT_H).raw) {
                  (bus->DMA2INT).previously_enabled = false;
                }
                gba_dma();
              }
              else {
                if (uVar6 == 0xdc) goto LAB_0014c67b;
                if (uVar6 == 0xde) {
                  if (-1 < (short)(bus->DMA3CNT_H).raw) {
                    (bus->DMA3INT).previously_enabled = false;
                  }
                  gba_dma();
                }
                else if (uVar6 == 0x102) {
                  tmcnth_write(0,uVar12);
                }
                else if (uVar6 == 0x106) {
                  tmcnth_write(1,uVar12);
                }
                else if (uVar6 == 0x10a) {
                  tmcnth_write(2,uVar12);
                }
                else if (uVar6 == 0x10e) {
                  tmcnth_write(3,uVar12);
                }
                else if (uVar6 == 0x204) {
                  on_waitcnt_updated();
                }
              }
            }
          }
        }
      }
      else if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable half ioreg 0x%08X\n\x1b[0;m",
               (ulong)local_390);
      }
LAB_0014c6fd:
      uVar8 = local_390 + 2;
      uVar4 = (ushort)(in_ESI >> 0x10);
      _Var3 = is_ioreg_writable(uVar8);
      if (_Var3) {
        local_16c = 0xffff;
        uVar6 = uVar8 & 0xfff;
        switch(uVar6) {
        case 0:
          local_98 = (gba_ppu_t *)&ppu->DISPCNT;
          break;
        default:
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                  ,0x1ce);
          fprintf(_stderr,"Access to unknown (but valid) half ioreg addr 0x%08X\n\x1b[0;m",
                  (ulong)uVar8);
          exit(1);
        case 2:
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
          }
          local_98 = (gba_ppu_t *)0x0;
          break;
        case 4:
          local_98 = (gba_ppu_t *)&ppu->DISPSTAT;
          break;
        case 6:
          local_98 = ppu;
          break;
        case 8:
          local_98 = (gba_ppu_t *)&ppu->BG0CNT;
          break;
        case 10:
          local_98 = (gba_ppu_t *)&ppu->BG1CNT;
          break;
        case 0xc:
          local_98 = (gba_ppu_t *)&ppu->BG2CNT;
          break;
        case 0xe:
          local_98 = (gba_ppu_t *)&ppu->BG3CNT;
          break;
        case 0x10:
          local_98 = (gba_ppu_t *)&ppu->BG0HOFS;
          break;
        case 0x12:
          local_98 = (gba_ppu_t *)&ppu->BG0VOFS;
          break;
        case 0x14:
          local_98 = (gba_ppu_t *)&ppu->BG1HOFS;
          break;
        case 0x16:
          local_98 = (gba_ppu_t *)&ppu->BG1VOFS;
          break;
        case 0x18:
          local_98 = (gba_ppu_t *)&ppu->BG2HOFS;
          break;
        case 0x1a:
          local_98 = (gba_ppu_t *)&ppu->BG2VOFS;
          break;
        case 0x1c:
          local_98 = (gba_ppu_t *)&ppu->BG3HOFS;
          break;
        case 0x1e:
          local_98 = (gba_ppu_t *)&ppu->BG3VOFS;
          break;
        case 0x20:
          local_98 = (gba_ppu_t *)&ppu->BG2PA;
          break;
        case 0x22:
          local_98 = (gba_ppu_t *)&ppu->BG2PB;
          break;
        case 0x24:
          local_98 = (gba_ppu_t *)&ppu->BG2PC;
          break;
        case 0x26:
          local_98 = (gba_ppu_t *)&ppu->BG2PD;
          break;
        case 0x30:
          local_98 = (gba_ppu_t *)&ppu->BG3PA;
          break;
        case 0x32:
          local_98 = (gba_ppu_t *)&ppu->BG3PB;
          break;
        case 0x34:
          local_98 = (gba_ppu_t *)&ppu->BG3PC;
          break;
        case 0x36:
          local_98 = (gba_ppu_t *)&ppu->BG3PD;
          break;
        case 0x40:
          local_98 = (gba_ppu_t *)&ppu->WIN0H;
          break;
        case 0x42:
          local_98 = (gba_ppu_t *)&ppu->WIN1H;
          break;
        case 0x44:
          local_98 = (gba_ppu_t *)&ppu->WIN0V;
          break;
        case 0x46:
          local_98 = (gba_ppu_t *)&ppu->WIN1V;
          break;
        case 0x48:
          local_98 = (gba_ppu_t *)&ppu->WININ;
          break;
        case 0x4a:
          local_98 = (gba_ppu_t *)&ppu->WINOUT;
          break;
        case 0x4c:
          local_98 = (gba_ppu_t *)&ppu->MOSAIC;
          break;
        case 0x50:
          local_98 = (gba_ppu_t *)&ppu->BLDCNT;
          break;
        case 0x52:
          local_98 = (gba_ppu_t *)&ppu->BLDALPHA;
          break;
        case 0x54:
          local_98 = (gba_ppu_t *)&ppu->BLDY;
          break;
        case 0x60:
        case 0x62:
        case 100:
        case 0x68:
        case 0x6c:
        case 0x70:
        case 0x72:
        case 0x74:
        case 0x78:
        case 0x7c:
        case 0x80:
        case 0x82:
        case 0x84:
        case 0x90:
        case 0x92:
        case 0x94:
        case 0x96:
        case 0x98:
        case 0x9a:
        case 0x9c:
        case 0x9e:
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m",
                   (ulong)uVar6);
          }
          local_98 = (gba_ppu_t *)0x0;
          break;
        case 0x88:
          local_98 = (gba_ppu_t *)&bus->SOUNDBIAS;
          break;
        case 0xb8:
          local_98 = (gba_ppu_t *)&bus->DMA0CNT_L;
          break;
        case 0xba:
          local_98 = (gba_ppu_t *)&bus->DMA0CNT_H;
          break;
        case 0xc4:
          local_98 = (gba_ppu_t *)&bus->DMA1CNT_L;
          break;
        case 0xc6:
          local_98 = (gba_ppu_t *)&bus->DMA1CNT_H;
          break;
        case 0xd0:
          local_98 = (gba_ppu_t *)&bus->DMA2CNT_L;
          break;
        case 0xd2:
          local_98 = (gba_ppu_t *)&bus->DMA2CNT_H;
          break;
        case 0xdc:
          local_98 = (gba_ppu_t *)&bus->DMA3CNT_L;
          break;
        case 0xde:
          local_98 = (gba_ppu_t *)&bus->DMA3CNT_H;
          break;
        case 0x100:
          local_98 = (gba_ppu_t *)bus->TMCNT_L;
          break;
        case 0x102:
          local_98 = (gba_ppu_t *)bus->TMCNT_H;
          break;
        case 0x104:
          local_98 = (gba_ppu_t *)(bus->TMCNT_L + 1);
          break;
        case 0x106:
          local_98 = (gba_ppu_t *)(bus->TMCNT_H + 1);
          break;
        case 0x108:
          local_98 = (gba_ppu_t *)(bus->TMCNT_L + 2);
          break;
        case 0x10a:
          local_98 = (gba_ppu_t *)(bus->TMCNT_H + 2);
          break;
        case 0x10c:
          local_98 = (gba_ppu_t *)(bus->TMCNT_L + 3);
          break;
        case 0x10e:
          local_98 = (gba_ppu_t *)(bus->TMCNT_H + 3);
          break;
        case 0x120:
        case 0x122:
        case 0x124:
        case 0x126:
        case 0x128:
        case 0x12a:
        case 0x150:
        case 0x154:
        case 0x158:
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m",
                   (ulong)uVar6);
          }
          local_98 = (gba_ppu_t *)0x0;
          break;
        case 0x130:
          local_98 = (gba_ppu_t *)&bus->KEYINPUT;
          break;
        case 0x132:
          local_98 = (gba_ppu_t *)&bus->KEYCNT;
          break;
        case 0x134:
          local_98 = (gba_ppu_t *)&bus->RCNT;
          break;
        case 0x140:
          local_98 = (gba_ppu_t *)&bus->JOYCNT;
          break;
        case 0x200:
          local_98 = (gba_ppu_t *)&bus->interrupt_enable;
          break;
        case 0x202:
          local_98 = (gba_ppu_t *)&bus->IF;
          break;
        case 0x204:
          local_98 = (gba_ppu_t *)&bus->WAITCNT;
          break;
        case 0x208:
          local_98 = (gba_ppu_t *)bus;
        }
        if (local_98 == (gba_ppu_t *)0x0) {
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m",(ulong)uVar8);
          }
        }
        else {
          uVar6 = uVar8 & 0xfff;
          if (uVar6 == 4) {
            local_16c = 0xfff8;
          }
          else {
            if (uVar6 == 0x202) {
              (bus->IF).raw = (bus->IF).raw & (uVar4 ^ 0xffff);
              break;
            }
            if (uVar6 == 0x208) {
              local_16c = 1;
            }
          }
          uVar12 = local_98->y;
          local_98->y = local_98->y & ~local_16c;
          local_98->y = local_98->y | uVar4 & local_16c;
          uVar6 = uVar8 & 0xfff;
          if (uVar6 == 0xb8) {
LAB_0014d27b:
            gba_dma();
          }
          else if (uVar6 == 0xba) {
            if (-1 < (short)(bus->DMA0CNT_H).raw) {
              (bus->DMA0INT).previously_enabled = false;
            }
            gba_dma();
          }
          else {
            if (uVar6 == 0xc4) goto LAB_0014d27b;
            if (uVar6 == 0xc6) {
              if (-1 < (short)(bus->DMA1CNT_H).raw) {
                (bus->DMA1INT).previously_enabled = false;
              }
              gba_dma();
            }
            else {
              if (uVar6 == 0xd0) goto LAB_0014d27b;
              if (uVar6 == 0xd2) {
                if (-1 < (short)(bus->DMA2CNT_H).raw) {
                  (bus->DMA2INT).previously_enabled = false;
                }
                gba_dma();
              }
              else {
                if (uVar6 == 0xdc) goto LAB_0014d27b;
                if (uVar6 == 0xde) {
                  if (-1 < (short)(bus->DMA3CNT_H).raw) {
                    (bus->DMA3INT).previously_enabled = false;
                  }
                  gba_dma();
                }
                else if (uVar6 == 0x102) {
                  tmcnth_write(0,uVar12);
                }
                else if (uVar6 == 0x106) {
                  tmcnth_write(1,uVar12);
                }
                else if (uVar6 == 0x10a) {
                  tmcnth_write(2,uVar12);
                }
                else if (uVar6 == 0x10e) {
                  tmcnth_write(3,uVar12);
                }
                else if (uVar6 == 0x204) {
                  on_waitcnt_updated();
                }
              }
            }
          }
        }
      }
      else if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable half ioreg 0x%08X\n\x1b[0;m",
               (ulong)uVar8);
      }
      break;
    case '\x04':
      local_1c4 = local_390;
      if ((in_EDI & 0xff00fffc) == 0x4000800) {
        local_1c4 = 0x4000800;
      }
      _Var3 = is_ioreg_writable(local_1c4);
      if ((!_Var3) && (gba_log_verbosity != 0)) {
        printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m",
               (ulong)local_1c4);
      }
      uVar6 = local_1c4 & 0xfff;
      if ((((uVar6 == 0x28) || (uVar6 == 0x2c)) || (uVar6 == 0x38)) || (uVar6 == 0x3c)) {
        switch(uVar6) {
        case 0x28:
          local_1b0 = &(ppu->BG2X).current;
          local_1b8 = &ppu->BG2X;
          break;
        default:
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                  ,0x298);
          fprintf(_stderr,"Fatal error- should not have ended up here.\n\x1b[0;m");
          exit(1);
        case 0x2c:
          local_1b0 = &(ppu->BG2Y).current;
          local_1b8 = &ppu->BG2Y;
          break;
        case 0x38:
          local_1b0 = &(ppu->BG3X).current;
          local_1b8 = &ppu->BG3X;
          break;
        case 0x3c:
          local_1b0 = &(ppu->BG3Y).current;
          local_1b8 = &ppu->BG3Y;
        }
        bVar11 = false;
        if (0xa0 < ppu->y) {
          bVar11 = ppu->y != 0xe3;
        }
        if (!bVar11) {
          local_1b0->raw = 0;
          local_1b0->raw = in_ESI | local_1b0->raw;
        }
        (local_1b8->initial).raw = 0;
        (local_1b8->initial).raw = in_ESI | (local_1b8->initial).raw;
      }
      else if (uVar6 == 0xa0) {
        write_fifo((gba_apu_t *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                   in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08,uVar8);
      }
      else if (uVar6 == 0xa4) {
        write_fifo((gba_apu_t *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                   in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08,uVar8);
      }
      else {
        _Var3 = is_ioreg_writable(local_1c4);
        if (_Var3) {
          uVar1 = get_ioreg_size_for_addr(local_1c4);
          if (uVar1 != '\x04') {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                    ,0x25f);
            fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
                    "Trying to get the address of a wrong-sized word ioreg");
            exit(1);
          }
          uVar6 = local_1c4 & 0xfff;
          if (uVar6 == 0x28) {
            local_48 = (addr_27b_t *)&ppu->BG2X;
          }
          else if (uVar6 == 0x2c) {
            local_48 = (addr_27b_t *)&ppu->BG2Y;
          }
          else if (uVar6 == 0x38) {
            local_48 = (addr_27b_t *)&ppu->BG3X;
          }
          else if (uVar6 == 0x3c) {
            local_48 = (addr_27b_t *)&ppu->BG3Y;
          }
          else if ((uVar6 == 0xa0) || (uVar6 == 0xa4)) {
LAB_0014d97a:
            local_48 = (addr_27b_t *)0x0;
          }
          else if (uVar6 == 0xb0) {
            local_48 = &bus->DMA0SAD;
          }
          else if (uVar6 == 0xb4) {
            local_48 = &bus->DMA0DAD;
          }
          else if (uVar6 == 0xbc) {
            local_48 = (addr_27b_t *)&bus->DMA1SAD;
          }
          else if (uVar6 == 0xc0) {
            local_48 = &bus->DMA1DAD;
          }
          else if (uVar6 == 200) {
            local_48 = (addr_27b_t *)&bus->DMA2SAD;
          }
          else if (uVar6 == 0xcc) {
            local_48 = &bus->DMA2DAD;
          }
          else if (uVar6 == 0xd4) {
            local_48 = (addr_27b_t *)&bus->DMA3SAD;
          }
          else {
            if (uVar6 != 0xd8) {
              if (((uVar6 != 0x150) && (uVar6 != 0x154)) && (uVar6 != 0x800)) {
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                        ,0x273);
                fprintf(_stderr,
                        "Tried to get the address of an unknown (but valid) word ioreg addr: 0x%08X\n\x1b[0;m"
                        ,(ulong)local_1c4);
                exit(1);
              }
              goto LAB_0014d97a;
            }
            local_48 = (addr_27b_t *)&bus->DMA3DAD;
          }
          if (local_48 == (addr_27b_t *)0x0) {
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                     ,(ulong)local_1c4,0xffffffff);
            }
          }
          else {
            local_48->raw = 0;
            local_48->raw = in_ESI | local_48->raw;
          }
        }
        else if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m",
                 (ulong)local_1c4);
        }
      }
    }
    break;
  case 5:
    *(uint *)(ppu->pram + (int)(local_390 + 0xfb000000 & 0x3ff)) = in_ESI;
    break;
  case 6:
    *(uint *)(ppu->vram + ((long)(int)((local_390 + 0xfa000000) % 0x18000) & 0xfffffffffffffffc)) =
         in_ESI;
    break;
  case 7:
    uVar6 = local_390 + 0xf9000000 & 0x3ff;
    ppu->oam[uVar6] = bVar2;
    *(uint *)(ppu->oam + (int)uVar6) = in_ESI;
    break;
  case 8:
    uVar12 = (uint16_t)((ulong)in_stack_fffffffffffffb00 >> 0x10);
    if (local_390 == 0x80000c4) {
      gpio_write(uVar8,uVar12);
      gpio_write(uVar8,uVar12);
      return;
    }
    if (local_390 == 0x80000c8) {
      gpio_write(uVar8,uVar12);
      return;
    }
  case 0xd:
    if ((bus->backup_type == EEPROM) && ((mem->rom_size < 0x1000001 || (0xdfffeff < local_390)))) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x5a4);
      fprintf(_stderr,"Write word 0x%08X to EEPROM at addr 0x%08X\n\x1b[0;m",(ulong)in_ESI,
              (ulong)local_390);
      exit(1);
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Ignoring write to cartridge space address 0x%08X\n",(ulong)local_390);
    }
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
    switch(bus->backup_type) {
    case UNKNOWN:
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Tried to access backup when backup type unknown!\n\x1b[0;m");
      }
      break;
    case SRAM:
      *(uint *)(mem->backup + (int)(in_EDI & 0x7ffc)) = in_ESI;
      mem->backup_dirty = true;
      break;
    case EEPROM:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x5ba);
      fprintf(_stderr,"Backup type EEPROM unimplemented!\n\x1b[0;m");
      exit(1);
    case FLASH64K:
    case FLASH128K:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x5bd);
      fprintf(_stderr,"Writing word to flash unimplemented\n\x1b[0;m");
      exit(1);
    default:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x5c0);
      fprintf(_stderr,"Unknown backup type index %d!\n\x1b[0;m",(ulong)bus->backup_type);
      exit(1);
    }
  default:
  }
  return;
}

Assistant:

void gba_write_word(word addr, word value, access_type_t access_type) {
    addr &= ~(sizeof(word) - 1);
    half region = addr >> 24;
    tick_memory_waitstate(access_type, sizeof(word), region);
    switch (region) {
        case REGION_BIOS: {
            logwarn("Tried to write to the BIOS!")
            break;
        }
        case REGION_EWRAM: {
            word index = (addr - 0x02000000) % 0x40000;
            word_to_byte_array(mem->ewram, index, value);
            break;
        }
        case REGION_IWRAM: {
            word index = (addr - 0x03000000) % 0x8000;
            word_to_byte_array(mem->iwram, index, value);
            break;
        }
        case REGION_IOREG: {
            if (addr < 0x04000400) {
                byte size = get_ioreg_size_for_addr(addr);
                switch (size) {
                    case 0:
                        return;
                    case sizeof(byte):
                        write_byte_ioreg(addr, value & 0xFF);
                        write_byte_ioreg(addr + 1, (value >> 8) & 0xFF);
                        write_byte_ioreg(addr + 2, (value >> 16) & 0xFF);
                        write_byte_ioreg(addr + 3, (value >> 24) & 0xFF);
                        break;
                    case sizeof(half):
                        write_half_ioreg(addr, value & 0xFFFF);
                        write_half_ioreg(addr + 2, (value >> 16) & 0xFFFF);
                        break;
                    case sizeof(word):
                        write_word_ioreg(addr, value);
                }
            }

#ifdef ENABLE_MGBA_DEBUG
            else {
                if (addr >= 0x4FFF600 && addr < 0x4FFF700) {
                    mgba_debug_write_byte(addr, value & 0xFF);
                    mgba_debug_write_byte(addr + 1, (value >> 8) & 0xFF);
                    mgba_debug_write_byte(addr + 2, (value >> 16) & 0xFF);
                    mgba_debug_write_byte(addr + 3, (value >> 24) & 0xFF);
                } else {
                    logfatal("Writing 0x%08X to 0x%08X\n", value, addr);
                }
            }
#endif
            break;
        }
        case REGION_PRAM: {
            word index = (addr - 0x5000000) % 0x400;
            word_to_byte_array(ppu->pram, index, value);
            break;
        }
        case REGION_VRAM: {
            word index = addr - 0x06000000;
            index %= VRAM_SIZE;
            word_to_byte_array(ppu->vram, index, value);
            break;
        }
        case REGION_OAM: {
            word index = addr - 0x07000000;
            index %= OAM_SIZE;
            ppu->oam[index] = value;
            word_to_byte_array(ppu->oam, index, value);
            break;
        }
        case REGION_GAMEPAK0_L:
            switch (addr) {
                case 0x080000C4:
                    gpio_write(0x080000C4, value & 0xFFFF);
                    gpio_write(0x080000C6, (value >> 16) & 0xFFFF);
                    return;
                case 0x080000C8:
                    gpio_write(0x080000C8, value & 0xFFFF);
                    return;
                default:
                    break;
            }
        case REGION_GAMEPAK2_H: {
            if (bus->backup_type == EEPROM) {
                if (mem->rom_size <= 0x1000000 || addr >= 0xDFFFF00) {
                    logfatal("Write word 0x%08X to EEPROM at addr 0x%08X", value, addr)
                }
            }
            logdebug("Ignoring write to cartridge space address 0x%08X", addr)
            break;
        }
        case REGION_GAMEPAK0_H:
        case REGION_GAMEPAK1_L:
        case REGION_GAMEPAK1_H:
        case REGION_GAMEPAK2_L:
        case REGION_SRAM:
        case REGION_SRAM_MIRR:
            // Backup space
            switch (bus->backup_type) {
                case SRAM:
                    word_to_byte_array(mem->backup, addr & 0x7FFF, value);
                    mem->backup_dirty = true;
                    break;
                case UNKNOWN:
                    logwarn("Tried to access backup when backup type unknown!")
                    break;
                case EEPROM:
                    logfatal("Backup type EEPROM unimplemented!")
                case FLASH64K:
                case FLASH128K:
                    logfatal("Writing word to flash unimplemented")
                    break;
                default:
                    logfatal("Unknown backup type index %d!", bus->backup_type)
            }
        default:
            return;
    }
}